

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schedules.cpp
# Opt level: O3

void CASC::Schedules::getLtb2017MzrSchedule(Property *property,Schedule *sched)

{
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f0;
  allocator<char> local_7f5;
  allocator<char> local_7f4;
  allocator<char> local_7f3;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  allocator<char> local_7f0;
  allocator<char> local_7ef;
  allocator<char> local_7ee;
  allocator<char> local_7ed;
  allocator<char> local_7ec;
  allocator<char> local_7eb;
  allocator<char> local_7ea;
  allocator<char> local_7e9;
  allocator<char> local_7e8;
  allocator<char> local_7e7;
  allocator<char> local_7e6;
  allocator<char> local_7e5;
  allocator<char> local_7e4;
  allocator<char> local_7e3;
  allocator<char> local_7e2;
  allocator<char> local_7e1;
  allocator<char> local_7e0;
  allocator<char> local_7df;
  allocator<char> local_7de;
  allocator<char> local_7dd;
  allocator<char> local_7dc;
  allocator<char> local_7db;
  allocator<char> local_7da;
  allocator<char> local_7d9;
  allocator<char> local_7d8;
  allocator<char> local_7d7;
  allocator<char> local_7d6;
  allocator<char> local_7d5;
  allocator<char> local_7d4;
  allocator<char> local_7d3;
  allocator<char> local_7d2;
  allocator<char> local_7d1;
  allocator<char> local_7d0;
  allocator<char> local_7cf;
  allocator<char> local_7ce;
  allocator<char> local_7cd;
  allocator<char> local_7cc;
  allocator<char> local_7cb;
  allocator<char> local_7ca;
  allocator<char> local_7c9;
  allocator<char> local_7c8;
  allocator<char> local_7c7;
  allocator<char> local_7c6;
  allocator<char> local_7c5;
  allocator<char> local_7c4;
  allocator<char> local_7c3;
  allocator<char> local_7c2;
  allocator<char> local_7c1;
  allocator<char> local_7c0;
  allocator<char> local_7bf;
  allocator<char> local_7be;
  allocator<char> local_7bd;
  allocator<char> local_7bc;
  allocator<char> local_7bb;
  allocator<char> local_7ba;
  allocator<char> local_7b9;
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "ott-11_8:1_drc=ordering:bsr=unit_only:lcm=predicate:nwc=1:sd=2:ss=axioms:st=1.2:sos=all:av=off:sp=reverse_arity_60"
             ,&local_7b9);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,
             "ott+1010_3:1_drc=ordering:bs=unit_only:bsr=unit_only:br=off:ccuc=first:cond=fast:fde=unused:gs=on:gsem=on:nwc=1:sd=2:ss=axioms:sos=on:sac=on:aac=none:acc=on:aer=off:afp=1000:afq=2.0:anc=all_dependent:sp=reverse_arity:urr=on:updr=off_60"
             ,&local_7ba);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_7ba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "lrs+1004_2_drc=ordering:bd=off:ccuc=small_ones:gs=on:gsem=off:gsssp=full:lwlo=on:nm=0:nwc=1:stl=300:sd=4:st=5.0:sos=all:sac=on:acc=on:add=off:aer=off:afp=100000:afq=1.2:anc=none:sp=occurrence:updr=off:uhcvi=on_60"
             ,&local_7bb);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_7bb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,
             "dis+10_5_drc=ordering:bsr=unit_only:cond=on:ep=RS:fde=unused:nm=0:nwc=1:sd=1:ss=axioms:sos=all:av=off_60"
             ,&local_7bc);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_7bc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,
             "lrs+11_5:1_drc=ordering:br=off:cond=fast:fde=unused:gsp=on:gs=on:gsem=on:gsssp=full:lcm=predicate:nm=0:nwc=1:nicw=on:stl=300:sd=1:ss=axioms:st=1.2:sac=on:add=large:afr=on:afp=40000:afq=1.4:amm=sco:anc=all:urr=on_60"
             ,&local_7bd);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_7bd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,
             "lrs+1011_8:1_drc=ordering:cond=on:fde=none:gsp=on:lwlo=on:nwc=1:stl=300:sd=2:ss=axioms:sos=all:av=off:sp=reverse_arity:urr=ec_only:updr=off:uhcvi=on_60"
             ,&local_7be);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_7be);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,
             "lrs+11_3_drc=ordering:br=off:cond=fast:gs=on:gsem=off:nwc=1:stl=300:sd=3:st=1.5:sos=all:sac=on:afr=on:afp=1000:afq=2.0:amm=sco:anc=none:sp=occurrence:urr=on:uhcvi=on_60"
             ,&local_7bf);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,
             "dis+10_2:1_drc=ordering:cond=fast:ep=RST:fsr=off:fde=unused:gsp=on:gs=on:gsaa=full_model:gsem=off:nm=0:nwc=1:sd=1:ss=axioms:st=5.0:sos=on:sac=on:add=off:afr=on:afp=100000:afq=1.4:amm=sco:anc=none:urr=on:updr=off:uhcvi=on_60"
             ,&local_7c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_7c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,
             "lrs+1002_1_drc=ordering:bsr=unit_only:nwc=1:stl=300:sd=1:ss=axioms:st=1.5:sos=all:av=off:updr=off:uhcvi=on_60"
             ,&local_7c1);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,
             "lrs+1_1_drc=ordering:bs=on:bsr=on:br=off:cond=fast:fsr=off:gs=on:gsem=off:lwlo=on:nwc=3:stl=300:sd=3:add=large:afr=on:afp=40000:afq=1.4:amm=off:anc=none:sp=occurrence:urr=on:updr=off_60"
             ,&local_7c2);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_7c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,
             "lrs-2_1_drc=ordering:cond=on:fde=unused:gs=on:gsaa=from_current:gsssp=full:lcm=predicate:nwc=1:stl=300:sd=4:ss=axioms:st=3.0:sos=on:sac=on:afr=on:afp=10000:afq=1.1:anc=none:updr=off_60"
             ,&local_7c3);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_7c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,
             "lrs+10_8:1_drc=ordering:bsr=unit_only:br=off:cond=on:fsr=off:gsp=on:gs=on:gsaa=from_current:nm=0:nwc=1:stl=300:sd=2:ss=axioms:st=1.2:sos=on:sac=on:add=large:afr=on:afp=1000:afq=1.1:amm=sco:anc=none:sp=reverse_arity:urr=on:updr=off:uhcvi=on_60"
             ,&local_7c4);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_7c4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,
             "dis+11_12_drc=ordering:cond=fast:nwc=1:sd=1:ss=axioms:st=1.5:sos=on:av=off:sp=reverse_arity:uhcvi=on_60"
             ,&local_7c5);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_7c5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,
             "dis+1010_3_drc=ordering:bsr=unit_only:cond=fast:fde=none:nwc=1:sd=2:ss=axioms:st=1.5:sos=all:av=off:sp=occurrence:uhcvi=on_60"
             ,&local_7c6);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_7c6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,
             "dis+1002_2:3_drc=ordering:fde=none:gsp=on:nm=0:nwc=1:sd=3:ss=axioms:sos=on:sac=on:afp=100000:afq=1.0:amm=sco:anc=none:sp=occurrence:updr=off_60"
             ,&local_7c7);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_7c7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,
             "lrs+10_3:1_drc=ordering:fde=unused:lcm=reverse:nwc=1:stl=300:sd=3:st=2.0:sos=all:av=off:sp=occurrence:uhcvi=on_60"
             ,&local_7c8);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_7c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,
             "lrs+10_2:3_drc=ordering:bsr=unit_only:cond=on:fde=none:gs=on:nwc=1:stl=300:sd=2:ss=axioms:sos=on:av=off:sp=reverse_arity_60"
             ,&local_7c9);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,
             "dis+1004_3:1_drc=ordering:bsr=unit_only:ep=R:fde=unused:gs=on:gsssp=full:nm=0:nwc=1:sos=all:sac=on:afr=on:afp=10000:afq=2.0:anc=all:sp=reverse_arity:urr=on:updr=off_60"
             ,&local_7ca);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_7ca);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,
             "ott+4_5:1_drc=ordering:br=off:cond=fast:fsr=off:nwc=1.3:av=off:sp=occurrence:urr=on:uhcvi=on_60"
             ,&local_7cb);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_7cb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,
             "dis+1010_1_drc=ordering:cond=fast:fsr=off:nwc=1.3:sd=2:ss=axioms:st=1.5:sos=on:acc=model:add=off:afp=4000:afq=2.0:uhcvi=on_60"
             ,&local_7cc);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_7cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b8,
             "lrs+11_2_drc=ordering:bd=off:bsr=unit_only:cond=on:lcm=predicate:lwlo=on:nm=64:nwc=1.1:stl=300:sd=1:ss=axioms:st=2.0:sos=all:av=off_60"
             ,&local_7cd);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_7cd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,
             "lrs+10_4:1_drc=ordering:bd=off:cond=fast:fde=unused:lcm=reverse:nm=0:nwc=1.2:stl=300:sd=2:ss=axioms:sos=all:av=off_60"
             ,&local_7ce);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_7ce);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,
             "dis+10_5_drc=ordering:ep=RST:fsr=off:gs=on:gsssp=full:lwlo=on:nm=0:nwc=1:sd=4:ss=axioms:sos=on:afr=on:afp=40000:afq=1.1:amm=off:anc=none:uhcvi=on_60"
             ,&local_7cf);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_7cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_318,
             "dis+1002_3_drc=ordering:ep=RST:fde=unused:gs=on:gsaa=full_model:gsem=off:nwc=1:sd=1:ss=axioms:st=2.0:sos=on:afp=100000:afq=1.1:anc=none:sp=occurrence:uhcvi=on_60"
             ,&local_7d0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,
             "dis+10_5_drc=ordering:cond=on:fsr=off:fde=none:gs=on:nwc=1:sd=2:ss=axioms:st=3.0:sos=on:av=off_60"
             ,&local_7d1);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,
             "ott-11_8:1_drc=ordering:bd=preordered:ccuc=first:er=known:fsr=off:fde=unused:gsp=on:lcm=predicate:nm=0:nwc=2:sd=3:ss=axioms:acc=on:afp=10000:afq=2.0:amm=sco:sp=occurrence:updr=off_60"
             ,&local_7d2);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_7d2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,
             "lrs+1011_1_drc=ordering:cond=on:fsr=off:gs=on:nwc=1:stl=300:sd=4:st=1.2:sos=on:av=off:sp=reverse_arity:urr=on_60"
             ,&local_7d3);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_7d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,
             "lrs+11_3:1_drc=ordering:bsr=unit_only:br=off:cond=on:ep=RST:fsr=off:gs=on:gsaa=from_current:gsem=off:nwc=3:stl=300:sd=2:ss=axioms:st=2.0:sac=on:add=large:afr=on:afp=100000:afq=1.4:amm=sco:anc=none:sp=reverse_arity:urr=on_60"
             ,&local_7d4);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_7d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b8,
             "dis+11_5:4_drc=ordering:ccuc=first:cond=on:er=known:fde=none:gs=on:nwc=1:sd=2:st=1.2:sos=all:aac=none:acc=model:add=large:afr=on:afp=10000:afq=1.2:anc=all_dependent:sp=reverse_arity:urr=on:uhcvi=on_60"
             ,&local_7d5);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_7d5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,
             "lrs+1010_2_drc=ordering:cond=on:fde=none:gs=on:gsem=off:nwc=1:stl=300:sd=3:st=1.2:sos=all:av=off:uhcvi=on_60"
             ,&local_7d6);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_7d6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,
             "lrs+10_5:4_drc=ordering:bd=off:ccuc=small_ones:cond=on:fde=none:gs=on:gsaa=from_current:gsem=off:nm=0:nwc=1:stl=300:sd=2:sos=on:acc=model:add=large:aer=off:afp=100000:afq=1.4:anc=none:urr=on_60"
             ,&local_7d7);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_7d7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,
             "dis+11_1_drc=ordering:ccuc=first:cond=on:fsr=off:fde=none:gs=on:gsem=off:lcm=predicate:nm=0:nwc=1:nicw=on:sd=3:acc=model:add=large:afp=4000:afq=1.4:anc=all:sp=occurrence:updr=off:uhcvi=on_60"
             ,&local_7d8);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,
             "dis+1_1_drc=ordering:fsr=off:gs=on:gsem=on:nwc=1:sd=1:ss=axioms:st=5.0:sos=all:acc=on:afr=on:afp=10000:afq=1.0:amm=sco:anc=none:sp=reverse_arity_60"
             ,&local_7d9);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,
             "dis+1004_2_drc=ordering:bs=unit_only:bsr=unit_only:fde=unused:gs=on:nwc=1:sos=on:add=large:afr=on_60"
             ,&local_7da);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_7da);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_478,
             "dis+11_4_drc=ordering:ep=RS:fde=none:gs=on:gsaa=full_model:gsem=off:nwc=1:sd=1:st=1.2:sos=all:sac=on:afp=10000:afq=1.1:amm=sco:anc=none:sp=reverse_arity:uhcvi=on_60"
             ,&local_7db);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_7db);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,
             "lrs+11_8_drc=ordering:br=off:cond=on:fde=none:gs=on:gsem=on:gsssp=full:nwc=1:nicw=on:stl=300:sd=1:ss=axioms:st=5.0:sos=all:sac=on:add=off:afp=100000:afq=1.4:amm=off:anc=all:sp=reverse_arity:urr=on:uhcvi=on_60"
             ,&local_7dc);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator(&local_7dc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b8,
             "ott+1_28_drc=ordering:cond=fast:er=filter:fde=none:gsp=on:lcm=reverse:nwc=1.1:sos=on:av=off:sp=reverse_arity:updr=off:uhcvi=on_60"
             ,&local_7dd);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_7dd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,
             "dis+10_14_drc=ordering:cond=fast:gs=on:gsaa=full_model:gsem=off:gsssp=full:nwc=1.5:sd=1:ss=axioms:st=1.5:afp=40000:afq=1.1:amm=sco:anc=none:sp=occurrence:updr=off_60"
             ,&local_7de);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_7de);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,
             "lrs+11_5_drc=ordering:fde=none:gsp=on:gs=on:gsem=on:nwc=1:stl=300:sd=3:ss=axioms:st=3.0:sos=on:av=off:sp=occurrence:urr=on_60"
             ,&local_7df);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_7df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_518,
             "lrs-10_4:1_drc=ordering:cond=on:fsr=off:fde=unused:gsp=on:gs=on:gsem=on:nwc=1:stl=300:sd=3:ss=axioms:sos=on:av=off:urr=on_60"
             ,&local_7e0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,
             "lrs+3_3:1_drc=ordering:bd=preordered:bs=on:bsr=unit_only:fsr=off:fde=unused:gs=on:gsem=off:nwc=1:nicw=on:stl=300:sd=2:ss=axioms:st=3.0:sos=all:sac=on:add=large:afp=40000:afq=1.2:amm=sco:anc=all_dependent:sp=reverse_arity:urr=ec_only_60"
             ,&local_7e1);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator(&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,
             "dis+11_3_drc=ordering:cond=fast:fsr=off:nwc=1:sd=1:ss=axioms:st=5.0:add=off:afr=on:afp=4000:afq=1.1:anc=none:sp=occurrence:updr=off_60"
             ,&local_7e2);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator(&local_7e2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_578,
             "dis+11_4_drc=ordering:bd=off:fsr=off:fde=unused:gs=on:gsaa=full_model:gsem=on:nwc=1:sd=1:ss=axioms:sac=on:add=large:afp=1000:afq=2.0:amm=sco:anc=none:sp=reverse_arity_60"
             ,&local_7e3);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_7e3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,
             "dis+1010_2_drc=ordering:bs=on:cond=fast:ep=RSTC:fde=unused:lwlo=on:nwc=1:sos=on:sac=on:add=off:afr=on:afp=10000:afq=1.4:sp=reverse_arity:uhcvi=on_60"
             ,&local_7e4);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator(&local_7e4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b8,
             "dis+10_5_drc=ordering:fsr=off:fde=unused:gs=on:gsem=on:gsssp=full:lcm=reverse:nwc=1:sd=2:ss=axioms:sos=on:add=large:afr=on:afp=1000:afq=1.1:amm=sco:anc=none:sp=occurrence:updr=off:uhcvi=on_60"
             ,&local_7e5);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator(&local_7e5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d8,
             "lrs+1_4:1_drc=ordering:br=off:cond=on:er=known:fsr=off:fde=unused:gs=on:nm=0:nwc=1:stl=600:sd=1:st=1.5:sos=on:sac=on:add=off:afp=4000:afq=1.1:amm=sco:anc=none:urr=on:updr=off:uhcvi=on_60"
             ,&local_7e6);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator(&local_7e6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,
             "dis+1010_5_drc=ordering:cond=fast:fde=unused:gs=on:gsem=on:nm=0:nwc=1:sd=2:ss=axioms:st=3.0:sos=on:av=off:sp=occurrence:updr=off:uhcvi=on_60"
             ,&local_7e7);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator(&local_7e7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_618,
             "lrs+11_8:1_drc=ordering:bd=off:fde=unused:nwc=1:stl=300:sd=2:ss=axioms:sos=on:av=off:updr=off:uhcvi=on_60"
             ,&local_7e8);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_638,
             "lrs+1003_4_drc=ordering:cond=on:fsr=off:fde=none:gs=on:gsem=off:nwc=1:stl=300:sd=3:sos=on:av=off:sp=reverse_arity:updr=off:uhcvi=on_60"
             ,&local_7e9);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,
             "dis-10_2:3_drc=ordering:cond=on:fde=none:nwc=1:sd=2:ss=axioms:st=2.0:sos=on:av=off:updr=off:uhcvi=on_60"
             ,&local_7ea);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_7ea);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_678,
             "dis+10_3_drc=ordering:cond=fast:fde=unused:gs=on:gsem=off:lwlo=on:nwc=1:sd=3:ss=axioms:sos=on:add=large:afp=10000:afq=2.0:anc=none:sp=reverse_arity_60"
             ,&local_7eb);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator(&local_7eb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_698,
             "lrs+11_4_drc=ordering:cond=on:fsr=off:fde=none:gsp=on:gs=on:gsem=on:gsssp=full:nwc=1:stl=300:sd=1:ss=axioms:st=2.0:sac=on:add=off:aer=off:afp=100000:afq=1.4:anc=none:sp=occurrence:updr=off:uhcvi=on_60"
             ,&local_7ec);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator(&local_7ec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b8,
             "ott+10_5:1_drc=ordering:bsr=unit_only:er=known:fsr=off:fde=none:gsp=on:lcm=reverse:nwc=2:av=off:sp=reverse_arity:urr=ec_only:uhcvi=on_60"
             ,&local_7ed);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_7ed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6d8,
             "ott+11_3:1_drc=ordering:bs=unit_only:bsr=unit_only:br=off:cond=on:fsr=off:fde=none:nwc=1:sd=1:ss=axioms:st=1.5:sos=on:av=off:sp=occurrence:urr=on_60"
             ,&local_7ee);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator(&local_7ee);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6f8,
             "dis-11_5:1_drc=ordering:bd=off:bsr=on:ccuc=small_ones:cond=on:fsr=off:fde=none:gs=on:lcm=predicate:nwc=10:acc=on:aer=off:afp=1000:afq=1.1:sp=occurrence:uhcvi=on_60"
             ,&local_7ef);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_7ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_718,"dis+11_5_drc=ordering_60",&local_7f0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator(&local_7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_738,
             "lrs+1_8:1_drc=ordering:bsr=on:fde=none:gs=on:lcm=reverse:nwc=1:stl=300:sd=2:st=1.5:sos=all:av=off:sp=reverse_arity_60"
             ,&local_7f1);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator(&local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_758,
             "lrs+11_12_drc=ordering:cond=fast:fde=unused:nwc=1:stl=600:sd=2:sos=all:av=off:sp=reverse_arity:uhcvi=on_60"
             ,&local_7f2);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_7f2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_778,
             "lrs+11_5:1_drc=ordering:bsr=unit_only:br=off:cond=fast:fsr=off:gs=on:nwc=1.2:stl=300:sd=1:ss=axioms:st=5.0:sos=all:av=off:sp=reverse_arity:urr=on_60"
             ,&local_7f3);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator(&local_7f3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_798,
             "lrs+1004_5:1_drc=ordering:ep=RST:fsr=off:nm=64:nwc=1.2:stl=600:add=off:aer=off:afr=on:afp=100000:afq=1.4:sp=occurrence:updr=off:uhcvi=on_60"
             ,&local_7f4);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_7f4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b8,
             "dis-11_1_drc=ordering:cond=fast:nm=0:nwc=1:sd=2:ss=axioms:sac=on:acc=model:afr=on:afp=100000:afq=1.2:amm=off:anc=all_dependent:sp=reverse_arity:uhcvi=on_60"
             ,&local_7f5);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator(&local_7f5);
  return;
}

Assistant:

void Schedules::getLtb2017MzrSchedule(const Property& property, Schedule& sched) {
  sched.push("ott-11_8:1_drc=ordering:bsr=unit_only:lcm=predicate:nwc=1:sd=2:ss=axioms:st=1.2:sos=all:av=off:sp=reverse_arity_60"); // MZR 1 (828)
  sched.push("ott+1010_3:1_drc=ordering:bs=unit_only:bsr=unit_only:br=off:ccuc=first:cond=fast:fde=unused:gs=on:gsem=on:nwc=1:sd=2:ss=axioms:sos=on:sac=on:aac=none:acc=on:aer=off:afp=1000:afq=2.0:anc=all_dependent:sp=reverse_arity:urr=on:updr=off_60"); // MZR 2 (112)
  sched.push("lrs+1004_2_drc=ordering:bd=off:ccuc=small_ones:gs=on:gsem=off:gsssp=full:lwlo=on:nm=0:nwc=1:stl=300:sd=4:st=5.0:sos=all:sac=on:acc=on:add=off:aer=off:afp=100000:afq=1.2:anc=none:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 4 (47)
  sched.push("dis+10_5_drc=ordering:bsr=unit_only:cond=on:ep=RS:fde=unused:nm=0:nwc=1:sd=1:ss=axioms:sos=all:av=off_60"); // MZR 5 (37)
  sched.push("lrs+11_5:1_drc=ordering:br=off:cond=fast:fde=unused:gsp=on:gs=on:gsem=on:gsssp=full:lcm=predicate:nm=0:nwc=1:nicw=on:stl=300:sd=1:ss=axioms:st=1.2:sac=on:add=large:afr=on:afp=40000:afq=1.4:amm=sco:anc=all:urr=on_60"); // MZR 6 (32)
  sched.push("lrs+1011_8:1_drc=ordering:cond=on:fde=none:gsp=on:lwlo=on:nwc=1:stl=300:sd=2:ss=axioms:sos=all:av=off:sp=reverse_arity:urr=ec_only:updr=off:uhcvi=on_60"); // MZR 7 (22)
  sched.push("lrs+11_3_drc=ordering:br=off:cond=fast:gs=on:gsem=off:nwc=1:stl=300:sd=3:st=1.5:sos=all:sac=on:afr=on:afp=1000:afq=2.0:amm=sco:anc=none:sp=occurrence:urr=on:uhcvi=on_60"); // MZR 8 (21)
  sched.push("dis+10_2:1_drc=ordering:cond=fast:ep=RST:fsr=off:fde=unused:gsp=on:gs=on:gsaa=full_model:gsem=off:nm=0:nwc=1:sd=1:ss=axioms:st=5.0:sos=on:sac=on:add=off:afr=on:afp=100000:afq=1.4:amm=sco:anc=none:urr=on:updr=off:uhcvi=on_60"); // MZR 9 (19)
  sched.push("lrs+1002_1_drc=ordering:bsr=unit_only:nwc=1:stl=300:sd=1:ss=axioms:st=1.5:sos=all:av=off:updr=off:uhcvi=on_60"); // MZR 10 (14)
  sched.push("lrs+1_1_drc=ordering:bs=on:bsr=on:br=off:cond=fast:fsr=off:gs=on:gsem=off:lwlo=on:nwc=3:stl=300:sd=3:add=large:afr=on:afp=40000:afq=1.4:amm=off:anc=none:sp=occurrence:urr=on:updr=off_60"); // MZR 11 (11)
  sched.push("lrs-2_1_drc=ordering:cond=on:fde=unused:gs=on:gsaa=from_current:gsssp=full:lcm=predicate:nwc=1:stl=300:sd=4:ss=axioms:st=3.0:sos=on:sac=on:afr=on:afp=10000:afq=1.1:anc=none:updr=off_60"); // MZR 12 (11)
  sched.push("lrs+10_8:1_drc=ordering:bsr=unit_only:br=off:cond=on:fsr=off:gsp=on:gs=on:gsaa=from_current:nm=0:nwc=1:stl=300:sd=2:ss=axioms:st=1.2:sos=on:sac=on:add=large:afr=on:afp=1000:afq=1.1:amm=sco:anc=none:sp=reverse_arity:urr=on:updr=off:uhcvi=on_60"); // MZR 13 (10)
  sched.push("dis+11_12_drc=ordering:cond=fast:nwc=1:sd=1:ss=axioms:st=1.5:sos=on:av=off:sp=reverse_arity:uhcvi=on_60"); // MZR 14 (8)
  sched.push("dis+1010_3_drc=ordering:bsr=unit_only:cond=fast:fde=none:nwc=1:sd=2:ss=axioms:st=1.5:sos=all:av=off:sp=occurrence:uhcvi=on_60"); // MZR 15 (8)
  sched.push("dis+1002_2:3_drc=ordering:fde=none:gsp=on:nm=0:nwc=1:sd=3:ss=axioms:sos=on:sac=on:afp=100000:afq=1.0:amm=sco:anc=none:sp=occurrence:updr=off_60"); // MZR 16 (7)
  sched.push("lrs+10_3:1_drc=ordering:fde=unused:lcm=reverse:nwc=1:stl=300:sd=3:st=2.0:sos=all:av=off:sp=occurrence:uhcvi=on_60"); // MZR 17 (6)
  sched.push("lrs+10_2:3_drc=ordering:bsr=unit_only:cond=on:fde=none:gs=on:nwc=1:stl=300:sd=2:ss=axioms:sos=on:av=off:sp=reverse_arity_60"); // MZR 18 (6)
  sched.push("dis+1004_3:1_drc=ordering:bsr=unit_only:ep=R:fde=unused:gs=on:gsssp=full:nm=0:nwc=1:sos=all:sac=on:afr=on:afp=10000:afq=2.0:anc=all:sp=reverse_arity:urr=on:updr=off_60"); // MZR 19 (5)
  sched.push("ott+4_5:1_drc=ordering:br=off:cond=fast:fsr=off:nwc=1.3:av=off:sp=occurrence:urr=on:uhcvi=on_60"); // MZR 20 (5)
  sched.push("dis+1010_1_drc=ordering:cond=fast:fsr=off:nwc=1.3:sd=2:ss=axioms:st=1.5:sos=on:acc=model:add=off:afp=4000:afq=2.0:uhcvi=on_60"); // MZR 21 (5)
  sched.push("lrs+11_2_drc=ordering:bd=off:bsr=unit_only:cond=on:lcm=predicate:lwlo=on:nm=64:nwc=1.1:stl=300:sd=1:ss=axioms:st=2.0:sos=all:av=off_60"); // MZR 22 (5)
  sched.push("lrs+10_4:1_drc=ordering:bd=off:cond=fast:fde=unused:lcm=reverse:nm=0:nwc=1.2:stl=300:sd=2:ss=axioms:sos=all:av=off_60"); // MZR 23 (5)
  sched.push("dis+10_5_drc=ordering:ep=RST:fsr=off:gs=on:gsssp=full:lwlo=on:nm=0:nwc=1:sd=4:ss=axioms:sos=on:afr=on:afp=40000:afq=1.1:amm=off:anc=none:uhcvi=on_60"); // MZR 24 (4)
  sched.push("dis+1002_3_drc=ordering:ep=RST:fde=unused:gs=on:gsaa=full_model:gsem=off:nwc=1:sd=1:ss=axioms:st=2.0:sos=on:afp=100000:afq=1.1:anc=none:sp=occurrence:uhcvi=on_60"); // MZR 25 (4)
  sched.push("dis+10_5_drc=ordering:cond=on:fsr=off:fde=none:gs=on:nwc=1:sd=2:ss=axioms:st=3.0:sos=on:av=off_60"); // MZR 26 (4)
  sched.push("ott-11_8:1_drc=ordering:bd=preordered:ccuc=first:er=known:fsr=off:fde=unused:gsp=on:lcm=predicate:nm=0:nwc=2:sd=3:ss=axioms:acc=on:afp=10000:afq=2.0:amm=sco:sp=occurrence:updr=off_60"); // MZR 27 (4)
  sched.push("lrs+1011_1_drc=ordering:cond=on:fsr=off:gs=on:nwc=1:stl=300:sd=4:st=1.2:sos=on:av=off:sp=reverse_arity:urr=on_60"); // MZR 29 (3)
  sched.push("lrs+11_3:1_drc=ordering:bsr=unit_only:br=off:cond=on:ep=RST:fsr=off:gs=on:gsaa=from_current:gsem=off:nwc=3:stl=300:sd=2:ss=axioms:st=2.0:sac=on:add=large:afr=on:afp=100000:afq=1.4:amm=sco:anc=none:sp=reverse_arity:urr=on_60"); // MZR 30 (3)
  sched.push("dis+11_5:4_drc=ordering:ccuc=first:cond=on:er=known:fde=none:gs=on:nwc=1:sd=2:st=1.2:sos=all:aac=none:acc=model:add=large:afr=on:afp=10000:afq=1.2:anc=all_dependent:sp=reverse_arity:urr=on:uhcvi=on_60"); // MZR 32 (3)
  sched.push("lrs+1010_2_drc=ordering:cond=on:fde=none:gs=on:gsem=off:nwc=1:stl=300:sd=3:st=1.2:sos=all:av=off:uhcvi=on_60"); // MZR 33 (3)
  sched.push("lrs+10_5:4_drc=ordering:bd=off:ccuc=small_ones:cond=on:fde=none:gs=on:gsaa=from_current:gsem=off:nm=0:nwc=1:stl=300:sd=2:sos=on:acc=model:add=large:aer=off:afp=100000:afq=1.4:anc=none:urr=on_60"); // MZR 35 (2)
  sched.push("dis+11_1_drc=ordering:ccuc=first:cond=on:fsr=off:fde=none:gs=on:gsem=off:lcm=predicate:nm=0:nwc=1:nicw=on:sd=3:acc=model:add=large:afp=4000:afq=1.4:anc=all:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 36 (2)
  sched.push("dis+1_1_drc=ordering:fsr=off:gs=on:gsem=on:nwc=1:sd=1:ss=axioms:st=5.0:sos=all:acc=on:afr=on:afp=10000:afq=1.0:amm=sco:anc=none:sp=reverse_arity_60"); // MZR 37 (2)
  sched.push("dis+1004_2_drc=ordering:bs=unit_only:bsr=unit_only:fde=unused:gs=on:nwc=1:sos=on:add=large:afr=on_60"); // MZR 38 (2)
  sched.push("dis+11_4_drc=ordering:ep=RS:fde=none:gs=on:gsaa=full_model:gsem=off:nwc=1:sd=1:st=1.2:sos=all:sac=on:afp=10000:afq=1.1:amm=sco:anc=none:sp=reverse_arity:uhcvi=on_60"); // MZR 39 (2)
  sched.push("lrs+11_8_drc=ordering:br=off:cond=on:fde=none:gs=on:gsem=on:gsssp=full:nwc=1:nicw=on:stl=300:sd=1:ss=axioms:st=5.0:sos=all:sac=on:add=off:afp=100000:afq=1.4:amm=off:anc=all:sp=reverse_arity:urr=on:uhcvi=on_60"); // MZR 40 (2)
  sched.push("ott+1_28_drc=ordering:cond=fast:er=filter:fde=none:gsp=on:lcm=reverse:nwc=1.1:sos=on:av=off:sp=reverse_arity:updr=off:uhcvi=on_60"); // MZR 41 (2)
  sched.push("dis+10_14_drc=ordering:cond=fast:gs=on:gsaa=full_model:gsem=off:gsssp=full:nwc=1.5:sd=1:ss=axioms:st=1.5:afp=40000:afq=1.1:amm=sco:anc=none:sp=occurrence:updr=off_60"); // MZR 43 (2)
  sched.push("lrs+11_5_drc=ordering:fde=none:gsp=on:gs=on:gsem=on:nwc=1:stl=300:sd=3:ss=axioms:st=3.0:sos=on:av=off:sp=occurrence:urr=on_60"); // MZR 45 (2)
  sched.push("lrs-10_4:1_drc=ordering:cond=on:fsr=off:fde=unused:gsp=on:gs=on:gsem=on:nwc=1:stl=300:sd=3:ss=axioms:sos=on:av=off:urr=on_60"); // MZR 46 (2)
  sched.push("lrs+3_3:1_drc=ordering:bd=preordered:bs=on:bsr=unit_only:fsr=off:fde=unused:gs=on:gsem=off:nwc=1:nicw=on:stl=300:sd=2:ss=axioms:st=3.0:sos=all:sac=on:add=large:afp=40000:afq=1.2:amm=sco:anc=all_dependent:sp=reverse_arity:urr=ec_only_60"); // MZR 47 (2)
  sched.push("dis+11_3_drc=ordering:cond=fast:fsr=off:nwc=1:sd=1:ss=axioms:st=5.0:add=off:afr=on:afp=4000:afq=1.1:anc=none:sp=occurrence:updr=off_60"); // MZR 48 (1)
  sched.push("dis+11_4_drc=ordering:bd=off:fsr=off:fde=unused:gs=on:gsaa=full_model:gsem=on:nwc=1:sd=1:ss=axioms:sac=on:add=large:afp=1000:afq=2.0:amm=sco:anc=none:sp=reverse_arity_60"); // MZR 49 (1)
  sched.push("dis+1010_2_drc=ordering:bs=on:cond=fast:ep=RSTC:fde=unused:lwlo=on:nwc=1:sos=on:sac=on:add=off:afr=on:afp=10000:afq=1.4:sp=reverse_arity:uhcvi=on_60"); // MZR 50 (1)
  sched.push("dis+10_5_drc=ordering:fsr=off:fde=unused:gs=on:gsem=on:gsssp=full:lcm=reverse:nwc=1:sd=2:ss=axioms:sos=on:add=large:afr=on:afp=1000:afq=1.1:amm=sco:anc=none:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 51 (1)
  sched.push("lrs+1_4:1_drc=ordering:br=off:cond=on:er=known:fsr=off:fde=unused:gs=on:nm=0:nwc=1:stl=600:sd=1:st=1.5:sos=on:sac=on:add=off:afp=4000:afq=1.1:amm=sco:anc=none:urr=on:updr=off:uhcvi=on_60"); // MZR 52 (1)
  sched.push("dis+1010_5_drc=ordering:cond=fast:fde=unused:gs=on:gsem=on:nm=0:nwc=1:sd=2:ss=axioms:st=3.0:sos=on:av=off:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 54 (1)
  sched.push("lrs+11_8:1_drc=ordering:bd=off:fde=unused:nwc=1:stl=300:sd=2:ss=axioms:sos=on:av=off:updr=off:uhcvi=on_60"); // MZR 55 (1)
  sched.push("lrs+1003_4_drc=ordering:cond=on:fsr=off:fde=none:gs=on:gsem=off:nwc=1:stl=300:sd=3:sos=on:av=off:sp=reverse_arity:updr=off:uhcvi=on_60"); // MZR 56 (1)
  sched.push("dis-10_2:3_drc=ordering:cond=on:fde=none:nwc=1:sd=2:ss=axioms:st=2.0:sos=on:av=off:updr=off:uhcvi=on_60"); // MZR 57 (1)
  sched.push("dis+10_3_drc=ordering:cond=fast:fde=unused:gs=on:gsem=off:lwlo=on:nwc=1:sd=3:ss=axioms:sos=on:add=large:afp=10000:afq=2.0:anc=none:sp=reverse_arity_60"); // MZR 58 (1)
  sched.push("lrs+11_4_drc=ordering:cond=on:fsr=off:fde=none:gsp=on:gs=on:gsem=on:gsssp=full:nwc=1:stl=300:sd=1:ss=axioms:st=2.0:sac=on:add=off:aer=off:afp=100000:afq=1.4:anc=none:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 59 (1)
  sched.push("ott+10_5:1_drc=ordering:bsr=unit_only:er=known:fsr=off:fde=none:gsp=on:lcm=reverse:nwc=2:av=off:sp=reverse_arity:urr=ec_only:uhcvi=on_60"); // MZR 60 (1)
  sched.push("ott+11_3:1_drc=ordering:bs=unit_only:bsr=unit_only:br=off:cond=on:fsr=off:fde=none:nwc=1:sd=1:ss=axioms:st=1.5:sos=on:av=off:sp=occurrence:urr=on_60"); // MZR 61 (1)
  sched.push("dis-11_5:1_drc=ordering:bd=off:bsr=on:ccuc=small_ones:cond=on:fsr=off:fde=none:gs=on:lcm=predicate:nwc=10:acc=on:aer=off:afp=1000:afq=1.1:sp=occurrence:uhcvi=on_60"); // MZR 62 (1)
  sched.push("dis+11_5_drc=ordering_60"); // MZR 63 (1)
  sched.push("lrs+1_8:1_drc=ordering:bsr=on:fde=none:gs=on:lcm=reverse:nwc=1:stl=300:sd=2:st=1.5:sos=all:av=off:sp=reverse_arity_60"); // MZR 64 (1)
  sched.push("lrs+11_12_drc=ordering:cond=fast:fde=unused:nwc=1:stl=600:sd=2:sos=all:av=off:sp=reverse_arity:uhcvi=on_60"); // MZR 65 (1)
  sched.push("lrs+11_5:1_drc=ordering:bsr=unit_only:br=off:cond=fast:fsr=off:gs=on:nwc=1.2:stl=300:sd=1:ss=axioms:st=5.0:sos=all:av=off:sp=reverse_arity:urr=on_60"); // MZR 66 (1)
  sched.push("lrs+1004_5:1_drc=ordering:ep=RST:fsr=off:nm=64:nwc=1.2:stl=600:add=off:aer=off:afr=on:afp=100000:afq=1.4:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 67 (1)
  sched.push("dis-11_1_drc=ordering:cond=fast:nm=0:nwc=1:sd=2:ss=axioms:sac=on:acc=model:afr=on:afp=100000:afq=1.2:amm=off:anc=all_dependent:sp=reverse_arity:uhcvi=on_60"); // MZR 68 (1)
}